

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsCreateWeakReference(JsValueRef value,JsWeakRef *weakRef)

{
  Recycler *this;
  code *pcVar1;
  bool bVar2;
  ThreadContext *pTVar3;
  undefined4 *puVar4;
  JsErrorCode JVar5;
  RecyclerHeapObjectInfo local_78;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (value == (JsValueRef)0x0) {
    JVar5 = JsErrorInvalidArgument;
  }
  else if (weakRef == (JsWeakRef *)0x0) {
    JVar5 = JsErrorNullArgument;
  }
  else {
    *weakRef = (JsWeakRef)0x0;
    bVar2 = Js::VarIs<Js::RecyclableObject>(value);
    JVar5 = JsNoWeakRefRequired;
    if (bVar2) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      pTVar3 = ThreadContext::GetContextForCurrentThread();
      if (pTVar3 == (ThreadContext *)0x0) {
        JVar5 = JsErrorNoCurrentContext;
      }
      else {
        this = pTVar3->recycler;
        JVar5 = JsErrorInObjectBeforeCollectCallback;
        if (this->objectBeforeCollectCallbackState == ObjectBeforeCollectCallback_None) {
          local_78.m_heapBlock = (HeapBlock *)0x0;
          local_78.field_3.m_attributes = (byte *)0x0;
          local_78.m_address = (void *)0x0;
          local_78.m_recycler = (Recycler *)0x0;
          local_78.isUsingLargeHeapBlock = false;
          bVar2 = Memory::Recycler::FindHeapObject(this,value,FindHeapObjectFlags_NoFlags,&local_78)
          ;
          JVar5 = JsErrorInvalidArgument;
          if (bVar2) {
            bVar2 = Memory::WeakReferenceHashTable<PrimePolicy>::FindOrAdd
                              (&this->weakReferenceMap,(char *)value,this,
                               (RecyclerWeakReferenceBase **)weakRef);
            JVar5 = JsNoError;
            if (!bVar2) {
              *(undefined ***)((long)*weakRef + 0x20) = &char::typeinfo;
              Memory::Recycler::TrackAllocWeakRef(this,(RecyclerWeakReferenceBase *)*weakRef);
            }
          }
        }
      }
      if ((JVar5 - JsErrorNoCurrentContext < 7) &&
         ((0x43U >> (JVar5 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                           ,0x89,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    }
  }
  return JVar5;
}

Assistant:

CHAKRA_API JsCreateWeakReference(
    _In_ JsValueRef value,
    _Out_ JsWeakRef* weakRef)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(weakRef);
    *weakRef = nullptr;

    if (Js::TaggedNumber::Is(value))
    {
        return JsNoWeakRefRequired;
    }

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }

        Recycler* recycler = threadContext->GetRecycler();
        if (recycler->IsInObjectBeforeCollectCallback())
        {
            return JsErrorInObjectBeforeCollectCallback;
        }

        RecyclerHeapObjectInfo dummyObjectInfo;
        if (!recycler->FindHeapObject(value, Memory::FindHeapObjectFlags::FindHeapObjectFlags_NoFlags, dummyObjectInfo))
        {
            // value is not recyler-allocated
            return JsErrorInvalidArgument;
        }

        recycler->FindOrCreateWeakReferenceHandle<char>(
            reinterpret_cast<char*>(value),
            reinterpret_cast<Memory::RecyclerWeakReference<char>**>(weakRef));
        return JsNoError;
    });
}